

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_float64_primitive_asInt32
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  sysbvm_tuple_t sVar2;
  
  if (argumentCount != 1) {
    sysbvm_error_argumentCountMismatch(1,argumentCount);
  }
  uVar1 = *arguments;
  sVar2 = 10;
  if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
    sVar2 = (long)(int)*(double *)(uVar1 + 0x10) << 4 | 10;
  }
  return sVar2;
}

Assistant:

static sysbvm_tuple_t sysbvm_float64_primitive_asInt32(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 1) sysbvm_error_argumentCountMismatch(1, argumentCount);

    return sysbvm_tuple_int32_encode(context, (int32_t)sysbvm_tuple_float64_decode(arguments[0]));
}